

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O2

int mipmap_image(uchar *orig,int width,int height,int channels,uchar *resampled,int block_size_x,
                int block_size_y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int local_a4;
  
  iVar7 = 0;
  iVar12 = 0;
  if ((((0 < block_size_y) && (iVar12 = 0, 0 < block_size_x)) &&
      (iVar12 = iVar7, resampled != (uchar *)0x0)) &&
     (((orig != (uchar *)0x0 && (0 < width)) && ((0 < height && (0 < channels)))))) {
    uVar14 = (ulong)(uint)width / (ulong)(uint)block_size_x;
    uVar4 = (ulong)(uint)height / (ulong)(uint)block_size_y;
    if ((int)uVar14 < 2) {
      uVar14 = 1;
    }
    if ((int)uVar4 < 2) {
      uVar4 = 1;
    }
    local_a4 = 0;
    iVar7 = 0;
    uVar15 = 0;
    iVar12 = block_size_y;
    while( true ) {
      iVar10 = iVar12;
      if (height < iVar12) {
        iVar10 = height;
      }
      iVar1 = iVar10 + iVar7;
      if (iVar10 + iVar7 < 1) {
        iVar1 = 0;
      }
      if (uVar4 <= uVar15) break;
      iVar10 = height - (int)uVar15 * block_size_y;
      if ((int)(uVar15 + 1) * block_size_y <= height) {
        iVar10 = block_size_y;
      }
      uVar5 = 0;
      iVar18 = local_a4;
      while (uVar5 < uVar14) {
        uVar8 = (uVar5 + 1) * (ulong)(uint)block_size_x;
        uVar13 = (ulong)(uint)(width - (int)uVar5 * block_size_y);
        if (uVar8 < (uint)width || uVar8 - (uint)width == 0) {
          uVar13 = (ulong)(uint)block_size_x;
        }
        iVar9 = (int)uVar13 * iVar10;
        if ((int)uVar13 < 1) {
          uVar13 = 0;
        }
        iVar17 = iVar18;
        for (uVar8 = 0; uVar8 != (uint)channels; uVar8 = uVar8 + 1) {
          iVar3 = iVar9 >> 1;
          iVar16 = iVar17;
          for (iVar6 = 0; uVar11 = uVar13, iVar2 = iVar16, iVar6 != iVar1; iVar6 = iVar6 + 1) {
            while (uVar11 != 0) {
              iVar3 = iVar3 + (uint)orig[iVar2];
              uVar11 = uVar11 - 1;
              iVar2 = iVar2 + channels;
            }
            iVar16 = iVar16 + channels * width;
          }
          resampled[uVar8 + (long)(((int)uVar5 + (int)uVar15 * (int)uVar14) * channels)] =
               (uchar)(iVar3 / iVar9);
          iVar17 = iVar17 + 1;
        }
        iVar18 = iVar18 + block_size_x * channels;
        uVar5 = uVar5 + 1;
      }
      iVar12 = iVar12 + block_size_y;
      iVar7 = iVar7 - block_size_y;
      local_a4 = local_a4 + channels * width * block_size_y;
      uVar15 = uVar15 + 1;
    }
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

int
	mipmap_image
	(
		const unsigned char* const orig,
		int width, int height, int channels,
		unsigned char* resampled,
		int block_size_x, int block_size_y
	)
{
	int mip_width, mip_height;
	int i, j, c;

	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) ||
		(resampled == NULL) ||
		(block_size_x < 1) || (block_size_y < 1) )
	{
		/*	nothing to do	*/
		return 0;
	}
	mip_width = width / block_size_x;
	mip_height = height / block_size_y;
	if( mip_width < 1 )
	{
		mip_width = 1;
	}
	if( mip_height < 1 )
	{
		mip_height = 1;
	}
	for( j = 0; j < mip_height; ++j )
	{
		for( i = 0; i < mip_width; ++i )
		{
			for( c = 0; c < channels; ++c )
			{
				const int index = (j*block_size_y)*width*channels + (i*block_size_x)*channels + c;
				int sum_value;
				int u,v;
				int u_block = block_size_x;
				int v_block = block_size_y;
				int block_area;
				/*	do a bit of checking so we don't over-run the boundaries
					(necessary for non-square textures!)	*/
				if( block_size_x * (i+1) > width )
				{
					u_block = width - i*block_size_y;
				}
				if( block_size_y * (j+1) > height )
				{
					v_block = height - j*block_size_y;
				}
				block_area = u_block*v_block;
				/*	for this pixel, see what the average
					of all the values in the block are.
					note: start the sum at the rounding value, not at 0	*/
				sum_value = block_area >> 1;
				for( v = 0; v < v_block; ++v )
				for( u = 0; u < u_block; ++u )
				{
					sum_value += orig[index + v*width*channels + u*channels];
				}
				resampled[j*mip_width*channels + i*channels + c] = sum_value / block_area;
			}
		}
	}
	return 1;
}